

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::ShapeInternal
               (FADREAL *x,int num,TPZVec<Fad<double>_> *phi,int transformation_index)

{
  FADREAL y;
  Fad<double> FStack_48;
  
  if (0 < num) {
    Fad<double>::Fad(&FStack_48);
    TransformPoint1d(transformation_index,x,&FStack_48);
    (*(code *)FADfOrthogonal)(&FStack_48,num,phi);
    Fad<double>::~Fad(&FStack_48);
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeInternal(FADREAL & x,int num,TPZVec<FADREAL> & phi,int transformation_index){
		// Quadratic or higher shape functions
		if(num <= 0) return;
		FADREAL y;
		TransformPoint1d(transformation_index,x,y);
		FADfOrthogonal(y,num,phi);
		//  TransformDerivative1d(transformation_index,num,phi);
	}